

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

float tcu::computeBilinearSearchStepFromFloatLine(LookupPrecision *prec,ColorLine *line)

{
  float fVar1;
  int i;
  long lVar2;
  uint uVar3;
  float fVar4;
  Vec4 stepCount;
  Vec4 minStep;
  Vector<float,_4> res_3;
  Vec4 d;
  
  stepCount.m_data[0] = 0.0;
  stepCount.m_data[1] = 0.0;
  stepCount.m_data[2] = 0.0;
  stepCount.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    stepCount.m_data[lVar2] = (line->p1).m_data[lVar2] - (line->p0).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  d.m_data[0] = 0.0;
  d.m_data[1] = 0.0;
  d.m_data[2] = 0.0;
  d.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    fVar1 = stepCount.m_data[lVar2];
    fVar4 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar4 = fVar1;
    }
    d.m_data[lVar2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  stepCount.m_data[0] = 0.0;
  stepCount.m_data[1] = 0.0;
  stepCount.m_data[2] = 0.0;
  stepCount.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    stepCount.m_data[lVar2] = d.m_data[lVar2] / (prec->colorThreshold).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    res_3.m_data[lVar2] = stepCount.m_data[lVar2] + 1.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  minStep.m_data[0] = 0.0;
  minStep.m_data[1] = 0.0;
  minStep.m_data[2] = 0.0;
  minStep.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    minStep.m_data[lVar2] = 1.0 / res_3.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 1;
  do {
    uVar3 = -(uint)(minStep.m_data[0] <= minStep.m_data[lVar2]);
    minStep.m_data[0] =
         (float)((uint)minStep.m_data[0] & uVar3 | ~uVar3 & (uint)minStep.m_data[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (minStep.m_data[0] <= 1.5258789e-05) {
    minStep.m_data[0] = 1.5258789e-05;
  }
  return minStep.m_data[0];
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}